

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_dist.hpp
# Opt level: O1

result_type_conflict1 __thiscall
trng::exponential_dist<float>::icdf(exponential_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  int *piVar2;
  float fVar3;
  
  if (0.0 <= x) {
    if (x <= 1.0) {
      if ((x == 1.0) && (!NAN(x))) {
        return INFINITY;
      }
      fVar1 = (this->P).mu_;
      fVar3 = logf(1.0 - x);
      return fVar3 * -fVar1;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x21;
  return NAN;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return -P.mu() * math::ln(1 - x);
    }